

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O1

void __thiscall Vector::Vector(Vector *this,Type *on)

{
  ulong uVar1;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  string local_60;
  string local_40;
  
  *(undefined ***)this = &PTR__Vector_0010ea68;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"/std/vector","");
  Typelib::Type::getName_abi_cxx11_();
  fullName(&local_40,&local_60);
  uVar1 = (**(code **)(*(long *)this + 0xc0))(this);
  Typelib::Container::Container
            (&this->super_Container,(string *)local_80,(string *)&local_40,uVar1,on);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  *(undefined ***)this = &PTR__Vector_0010ea68;
  getElementLayout(&this->element_layout,on);
  return;
}

Assistant:

Vector::Vector(Type const& on)
    : Container("/std/vector", fullName(on.getName()), getNaturalSize(), on)
    , element_layout(getElementLayout(on))
{
}